

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
libtorrent::torrent_handle::url_seeds_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,torrent_handle *this)

{
  int iVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_48;
  
  if (url_seeds[abi:cxx11]()::empty_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&url_seeds[abi:cxx11]()::empty_abi_cxx11_);
    if (iVar1 != 0) {
      url_seeds[abi:cxx11]()::empty_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
           = _S_red;
      url_seeds[abi:cxx11]()::empty_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      url_seeds[abi:cxx11]()::empty_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
           = &url_seeds[abi:cxx11]()::empty_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      url_seeds[abi:cxx11]()::empty_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
           = &url_seeds[abi:cxx11]()::empty_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      url_seeds[abi:cxx11]()::empty_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(::std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&url_seeds[abi:cxx11]()::empty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&url_seeds[abi:cxx11]()::empty_abi_cxx11_);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&_Stack_48,&url_seeds[abi:cxx11]()::empty_abi_cxx11_._M_t);
  sync_call_ret<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>(libtorrent::aux::torrent::*)()const>
            (__return_storage_ptr__,this,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&_Stack_48,0x2e6340);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_48);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> torrent_handle::url_seeds() const
	{
		static const std::set<std::string> empty;
		return sync_call_ret<std::set<std::string>>(empty, &aux::torrent::web_seeds);
	}